

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O0

void Dch_PerformRandomSimulation(Aig_Man_t *pAig,Vec_Ptr_t *vSims)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  uint *puVar7;
  Aig_Obj_t *pAVar8;
  uint *puVar9;
  uint *puVar10;
  int local_40;
  int nWords;
  int k;
  int i;
  Aig_Obj_t *pObj;
  uint *pSim1;
  uint *pSim0;
  uint *pSim;
  Vec_Ptr_t *vSims_local;
  Aig_Man_t *pAig_local;
  
  pvVar4 = Vec_PtrEntry(vSims,1);
  pvVar5 = Vec_PtrEntry(vSims,0);
  iVar1 = (int)((long)pvVar4 - (long)pvVar5 >> 2);
  pAVar6 = Aig_ManConst1(pAig);
  puVar7 = Dch_ObjSim(vSims,pAVar6);
  memset(puVar7,0xff,(long)iVar1 << 2);
  for (nWords = 0; iVar2 = Vec_PtrSize(pAig->vCis), nWords < iVar2; nWords = nWords + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,nWords);
    puVar7 = Dch_ObjSim(vSims,pAVar6);
    for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
      uVar3 = Dch_ObjRandomSim();
      puVar7[local_40] = uVar3;
    }
    *puVar7 = *puVar7 << 1;
  }
  for (nWords = 0; iVar2 = Vec_PtrSize(pAig->vObjs), nWords < iVar2; nWords = nWords + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,nWords);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar6), iVar2 != 0)) {
      pAVar8 = Aig_ObjFanin0(pAVar6);
      puVar7 = Dch_ObjSim(vSims,pAVar8);
      pAVar8 = Aig_ObjFanin1(pAVar6);
      puVar9 = Dch_ObjSim(vSims,pAVar8);
      puVar10 = Dch_ObjSim(vSims,pAVar6);
      iVar2 = Aig_ObjFaninC0(pAVar6);
      if ((iVar2 == 0) || (iVar2 = Aig_ObjFaninC1(pAVar6), iVar2 == 0)) {
        iVar2 = Aig_ObjFaninC0(pAVar6);
        if ((iVar2 == 0) || (iVar2 = Aig_ObjFaninC1(pAVar6), iVar2 != 0)) {
          iVar2 = Aig_ObjFaninC0(pAVar6);
          if ((iVar2 == 0) && (iVar2 = Aig_ObjFaninC1(pAVar6), iVar2 != 0)) {
            for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
              puVar10[local_40] = puVar7[local_40] & (puVar9[local_40] ^ 0xffffffff);
            }
          }
          else {
            for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
              puVar10[local_40] = puVar7[local_40] & puVar9[local_40];
            }
          }
        }
        else {
          for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
            puVar10[local_40] = (puVar7[local_40] ^ 0xffffffff) & puVar9[local_40];
          }
        }
      }
      else {
        for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
          puVar10[local_40] = (puVar7[local_40] ^ 0xffffffff) & (puVar9[local_40] ^ 0xffffffff);
        }
      }
    }
  }
  return;
}

Assistant:

void Dch_PerformRandomSimulation( Aig_Man_t * pAig, Vec_Ptr_t * vSims )
{
    unsigned * pSim, * pSim0, * pSim1;
    Aig_Obj_t * pObj;
    int i, k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);

    // assign const 1 sim info
    pObj = Aig_ManConst1(pAig);
    pSim = Dch_ObjSim( vSims, pObj );
    memset( pSim, 0xff, sizeof(unsigned) * nWords );

    // assign primary input random sim info
    Aig_ManForEachCi( pAig, pObj, i )
    {
        pSim = Dch_ObjSim( vSims, pObj );
        for ( k = 0; k < nWords; k++ )
            pSim[k] = Dch_ObjRandomSim();
        pSim[0] <<= 1;
    }

    // simulate AIG in the topological order
    Aig_ManForEachNode( pAig, pObj, i )
    {
        pSim0 = Dch_ObjSim( vSims, Aig_ObjFanin0(pObj) ); 
        pSim1 = Dch_ObjSim( vSims, Aig_ObjFanin1(pObj) ); 
        pSim  = Dch_ObjSim( vSims, pObj );

        if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // both are compls
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = ~pSim0[k] & ~pSim1[k];
        }
        else if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) ) // first one is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = ~pSim0[k] & pSim1[k];
        }
        else if ( !Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // second one is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = pSim0[k] & ~pSim1[k];
        }
        else // if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // none is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = pSim0[k] & pSim1[k];
        }
    }
    // get simulation information for primary outputs
}